

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

shared_ptr<minja::Expression> __thiscall minja::Parser::parseDictionary(Parser *this)

{
  size_type sVar1;
  runtime_error *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  Parser *pPVar3;
  Parser *in_RSI;
  shared_ptr<minja::Expression> sVar4;
  allocator<char> local_a9;
  string local_a8;
  Parser *local_80;
  string local_78;
  vector<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>_>_>
  elements;
  anon_class_16_2_3265e732 parseKeyValuePair;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"{",(allocator<char> *)&elements);
  local_80 = this;
  consumeToken(&local_78,in_RSI,&local_a8,Strip);
  sVar1 = local_78._M_string_length;
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_a8);
  if (sVar1 == 0) {
    (local_80->template_str).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    (local_80->template_str).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    _Var2._M_pi = extraout_RDX;
  }
  else {
    elements.
    super__Vector_base<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    elements.
    super__Vector_base<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    elements.
    super__Vector_base<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"}",(allocator<char> *)&parseKeyValuePair);
    consumeToken(&local_78,in_RSI,&local_a8,Strip);
    sVar1 = local_78._M_string_length;
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_a8);
    if (sVar1 == 0) {
      parseKeyValuePair.elements = &elements;
      parseDictionary::anon_class_16_2_3265e732::operator()(&parseKeyValuePair);
      do {
        if ((in_RSI->it)._M_current == (in_RSI->end)._M_current) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,"Expected closing brace");
LAB_001ad0e5:
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,",",&local_a9);
        consumeToken(&local_78,in_RSI,&local_a8,Strip);
        sVar1 = local_78._M_string_length;
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)&local_a8);
        if (sVar1 == 0) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"}",&local_a9);
          consumeToken(&local_78,in_RSI,&local_a8,Strip);
          std::__cxx11::string::~string((string *)&local_78);
          std::__cxx11::string::~string((string *)&local_a8);
          if (local_78._M_string_length != 0) {
            get_location((Location *)&local_78,in_RSI);
            pPVar3 = local_80;
            std::
            make_shared<minja::DictExpr,minja::Location,std::vector<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::Expression>>,std::allocator<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::Expression>>>>>
                      ((Location *)&local_a8,
                       (vector<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>_>_>
                        *)&local_78);
            goto LAB_001ad088;
          }
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,"Expected comma or closing brace in dictionary")
          ;
          goto LAB_001ad0e5;
        }
        parseDictionary::anon_class_16_2_3265e732::operator()(&parseKeyValuePair);
      } while( true );
    }
    get_location((Location *)&local_78,in_RSI);
    pPVar3 = local_80;
    std::
    make_shared<minja::DictExpr,minja::Location,std::vector<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::Expression>>,std::allocator<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::Expression>>>>>
              ((Location *)&local_a8,
               (vector<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>_>_>
                *)&local_78);
LAB_001ad088:
    sVar1 = local_a8._M_string_length;
    local_a8._M_string_length = 0;
    (pPVar3->template_str).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)local_a8._M_dataplus._M_p;
    (pPVar3->template_str).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar1;
    local_a8._M_dataplus._M_p = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a8._M_string_length);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_78._M_string_length);
    std::
    vector<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::Expression>_>_>_>
    ::~vector(&elements);
    _Var2._M_pi = extraout_RDX_00;
    local_80 = pPVar3;
  }
  sVar4.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar4.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_80;
  return (shared_ptr<minja::Expression>)
         sVar4.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Expression> parseDictionary() {
        if (consumeToken("{").empty()) return nullptr;

        std::vector<std::pair<std::shared_ptr<Expression>, std::shared_ptr<Expression>>> elements;
        if (!consumeToken("}").empty()) {
            return std::make_shared<DictExpr>(get_location(), std::move(elements));
        }

        auto parseKeyValuePair = [&]() {
            auto key = parseExpression();
            if (!key) throw std::runtime_error("Expected key in dictionary");
            if (consumeToken(":").empty()) throw std::runtime_error("Expected colon betweek key & value in dictionary");
            auto value = parseExpression();
            if (!value) throw std::runtime_error("Expected value in dictionary");
            elements.emplace_back(std::pair(std::move(key), std::move(value)));
        };

        parseKeyValuePair();

        while (it != end) {
            if (!consumeToken(",").empty()) {
                parseKeyValuePair();
            } else if (!consumeToken("}").empty()) {
                return std::make_shared<DictExpr>(get_location(), std::move(elements));
            } else {
                throw std::runtime_error("Expected comma or closing brace in dictionary");
            }
        }
        throw std::runtime_error("Expected closing brace");
    }